

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O1

void __thiscall
validation_layer::basic_leakChecker::ZEbasic_leakChecker::~ZEbasic_leakChecker
          (ZEbasic_leakChecker *this)

{
  pointer pbVar1;
  long lVar2;
  long lVar3;
  mapped_type *pmVar4;
  ctorsAndDtors *s;
  pointer pcVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  value_type name;
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_> set;
  key_type local_80;
  ZEbasic_leakChecker *local_60;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_58;
  pointer local_50;
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_> local_48
  ;
  
  (this->super_ZEValidationEntryPoints)._vptr_ZEValidationEntryPoints =
       (_func_int **)&PTR_zeInitPrologue_001f9178;
  local_60 = this;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Check balance of create/destroy calls\n",0x26);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"----------------------------------------------------------\n",
             0x3b);
  createDestroySet();
  local_50 = local_48.
             super__Vector_base<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_48.
      super__Vector_base<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_58 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&local_60->counts;
    pcVar5 = local_48.
             super__Vector_base<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if ((pcVar5->ctors).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          (pcVar5->ctors).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar7 = 0;
      }
      else {
        lVar8 = 8;
        lVar7 = 0;
        uVar6 = 0;
        do {
          pbVar1 = (pcVar5->ctors).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          lVar2 = *(long *)((long)pbVar1 + lVar8 + -8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,lVar2,
                     *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar8) + lVar2);
          pmVar4 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](local_58,&local_80);
          lVar2 = (pmVar4->super___atomic_base<long>)._M_i;
          if (uVar6 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," |\n",3);
          }
          lVar3 = std::cerr;
          *(undefined8 *)(&std::runtime_error::typeinfo + *(long *)(std::cerr + -0x18)) = 0x1e;
          *(uint *)(gmtime_r + *(long *)(lVar3 + -0x18)) =
               *(uint *)(gmtime_r + *(long *)(lVar3 + -0x18)) & 0xffffff4f | 0x80;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_80._M_dataplus._M_p,local_80._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," = ",3);
          lVar3 = std::cerr;
          *(undefined8 *)(&std::runtime_error::typeinfo + *(long *)(std::cerr + -0x18)) = 5;
          *(uint *)(gmtime_r + *(long *)(lVar3 + -0x18)) =
               *(uint *)(gmtime_r + *(long *)(lVar3 + -0x18)) & 0xffffff4f | 0x20;
          std::ostream::_M_insert<long>((long)&std::cerr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          lVar7 = lVar7 + lVar2;
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 0x20;
        } while (uVar6 < (ulong)((long)(pcVar5->ctors).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pcVar5->ctors).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," \\--->",6);
      if ((pcVar5->dtors).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (pcVar5->dtors).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar8 = 8;
        uVar6 = 0;
        do {
          pbVar1 = (pcVar5->dtors).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          lVar2 = *(long *)((long)pbVar1 + lVar8 + -8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,lVar2,
                     *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar8) + lVar2);
          pmVar4 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](local_58,&local_80);
          lVar2 = (pmVar4->super___atomic_base<long>)._M_i;
          if (uVar6 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
            lVar3 = std::cerr;
            *(undefined8 *)(&std::runtime_error::typeinfo + *(long *)(std::cerr + -0x18)) = 0x2c;
            *(uint *)(gmtime_r + *(long *)(lVar3 + -0x18)) =
                 *(uint *)(gmtime_r + *(long *)(lVar3 + -0x18)) & 0xffffff4f | 0x80;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\\--->",5);
          }
          lVar3 = std::cerr;
          *(undefined8 *)(&std::runtime_error::typeinfo + *(long *)(std::cerr + -0x18)) = 0x1e;
          *(uint *)(gmtime_r + *(long *)(lVar3 + -0x18)) =
               *(uint *)(gmtime_r + *(long *)(lVar3 + -0x18)) & 0xffffff4f | 0x80;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_80._M_dataplus._M_p,local_80._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," = ",3);
          lVar3 = std::cerr;
          *(undefined8 *)(&std::runtime_error::typeinfo + *(long *)(std::cerr + -0x18)) = 5;
          *(uint *)(gmtime_r + *(long *)(lVar3 + -0x18)) =
               *(uint *)(gmtime_r + *(long *)(lVar3 + -0x18)) & 0xffffff4f | 0x20;
          std::ostream::_M_insert<long>((long)&std::cerr);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          lVar7 = lVar7 - lVar2;
          uVar6 = uVar6 + 1;
          lVar8 = lVar8 + 0x20;
        } while (uVar6 < (ulong)((long)(pcVar5->dtors).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pcVar5->dtors).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      if (lVar7 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," ---> LEAK = ",0xd);
        std::ostream::_M_insert<long>((long)&std::cerr);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      pcVar5 = pcVar5 + 1;
    } while (pcVar5 != local_50);
  }
  std::vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>::
  ~vector(&local_48);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::atomic<long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(local_60->counts)._M_h);
  return;
}

Assistant:

basic_leakChecker::ZEbasic_leakChecker::~ZEbasic_leakChecker() {
        std::cerr << "Check balance of create/destroy calls\n";
        std::cerr << "----------------------------------------------------------\n";
        auto set = createDestroySet();
        for (const auto &s : set) {
            auto &ctors = s.ctors;
            auto &dtors = s.dtors;
            int64_t diff = 0;
            for (size_t i = 0; i < ctors.size(); i++) {
                auto name = ctors[i];
                auto zeCount = counts[name].load();
                diff += zeCount;

                if (i > 0) {
                    std::cerr << " |\n";
                }

                std::cerr << std::setw(30) << std::right << name;
                std::cerr << " = ";
                std::cerr << std::setw(5) << std::left << zeCount;
            }

            std::cerr << " \\--->";

            for (size_t i = 0; i < dtors.size(); i++) {
                auto name = dtors[i];
                auto zeCount = counts[name].load();
                diff -= zeCount;

                if (i > 0) {
                    std::cerr << "\n";
                    std::cerr << std::setw(44) << std::right << "\\--->";
                }

                std::cerr << std::setw(30) << std::right << name;
                std::cerr << " = ";
                std::cerr << std::setw(5) << std::left << zeCount;
            }

            if (diff) {
                std::cerr << " ---> LEAK = " << diff;
            }

            std::cerr << std::endl;
        }
    }